

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection_manager.c
# Opt level: O1

void apx_connectionManager_destroy(apx_connectionManager_t *self)

{
  if (self != (apx_connectionManager_t *)0x0) {
    apx_connectionManager_stop(self);
    adt_list_destroy(&self->active_connections);
    adt_list_destroy(&self->inactive_connections);
    adt_u32Set_destroy(&self->connection_id_set);
    pthread_spin_destroy(&self->lock);
    return;
  }
  return;
}

Assistant:

void apx_connectionManager_destroy(apx_connectionManager_t *self)
{
   if (self != 0)
   {
      apx_connectionManager_stop(self);
      adt_list_destroy(&self->active_connections);
      adt_list_destroy(&self->inactive_connections);
      adt_u32Set_destroy(&self->connection_id_set);
      SPINLOCK_DESTROY(self->lock);
   }
}